

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_tables.c
# Opt level: O0

int mm_table_save(mm_context_t *context,uint8_t table_id,uint64_t version_timestamp,uint8_t *buffer,
                 size_t buflen)

{
  int iVar1;
  char local_238 [4];
  int rc;
  char sql [512];
  size_t buflen_local;
  uint8_t *buffer_local;
  uint64_t version_timestamp_local;
  uint8_t table_id_local;
  mm_context_t *context_local;
  
  memset(local_238,0,0x200);
  snprintf(local_238,0x200,
           "REPLACE INTO TERMDAT (TABLE_ID, VERSION_TIMESTAMP, DATA_LENGTH, TABLE_DATA)VALUES ( %d, %lu, %zd, ?);"
           ,(ulong)table_id,version_timestamp,buflen);
  *buffer = table_id;
  iVar1 = mm_sql_write_blob(context->database,local_238,buffer,buflen);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s: Error writing table %d, version %lu\n","mm_table_save",(ulong)table_id,
            version_timestamp);
  }
  return iVar1;
}

Assistant:

int mm_table_save(mm_context_t* context, uint8_t table_id, uint64_t version_timestamp, uint8_t* buffer, size_t buflen) {
    char sql[512] = { 0 };
    int rc;

    snprintf(sql, sizeof(sql), "REPLACE INTO TERMDAT (TABLE_ID, VERSION_TIMESTAMP, DATA_LENGTH, TABLE_DATA)"
        "VALUES ( %d, %" PRIu64 ", %zd, ?);",
        table_id,
        version_timestamp,
        buflen);

    buffer[0] = table_id;

    rc = mm_sql_write_blob(context->database, sql, buffer, buflen);

    if (rc != 0) {
        fprintf(stderr, "%s: Error writing table %d, version %" PRIu64 "\n", __func__, table_id, version_timestamp);
    }

    return rc;
}